

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_cell_below_quality
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_DBL min_quality,REF_GLOB *nnode_global,
          REF_LONG *ncell_global,REF_GLOB **l2c)

{
  REF_MPI ref_mpi_00;
  REF_NODE ref_node_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_GLOB *pRVar3;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_DBL quality;
  REF_GLOB offset;
  REF_INT *counts;
  int local_d0;
  REF_INT proc;
  REF_INT ncell;
  REF_INT nnode;
  REF_INT nodes [27];
  REF_INT cell;
  REF_INT part;
  REF_INT node;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GLOB **l2c_local;
  REF_LONG *ncell_global_local;
  REF_GLOB *nnode_global_local;
  REF_DBL min_quality_local;
  REF_CELL ref_cell_local;
  REF_GRID ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  ref_node_00 = ref_grid->node;
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x51,
           "ref_gather_cell_below_quality","malloc *l2c of REF_GLOB negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    pRVar3 = (REF_GLOB *)malloc((long)ref_node_00->max << 3);
    *l2c = pRVar3;
    if (*l2c == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x51
             ,"ref_gather_cell_below_quality","malloc *l2c of REF_GLOB NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node_00->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        (*l2c)[ref_private_macro_code_rss_1] = -1;
      }
      *nnode_global = 0;
      *ncell_global = 0;
      proc = 0;
      local_d0 = 0;
      for (nodes[0x19] = 0; nodes[0x19] < ref_cell->max; nodes[0x19] = nodes[0x19] + 1) {
        RVar1 = ref_cell_nodes(ref_cell,nodes[0x19],&ncell);
        if (RVar1 == 0) {
          uVar2 = ref_cell_part(ref_cell,ref_node_00,nodes[0x19],nodes + 0x1a);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x59,"ref_gather_cell_below_quality",(ulong)uVar2,"part");
            return uVar2;
          }
          if (ref_mpi_00->id == nodes[0x1a]) {
            uVar2 = ref_node_tet_quality(ref_node_00,&ncell,(REF_DBL *)&ref_private_macro_code_rss);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x5b,"ref_gather_cell_below_quality",(ulong)uVar2,"qual");
              return uVar2;
            }
            if (_ref_private_macro_code_rss < min_quality) {
              local_d0 = local_d0 + 1;
              for (cell = 0; cell < ref_cell->node_per; cell = cell + 1) {
                if ((ref_node_00->ref_mpi->id == ref_node_00->part[(&ncell)[cell]]) &&
                   ((*l2c)[(&ncell)[cell]] == -1)) {
                  (*l2c)[(&ncell)[cell]] = (long)proc;
                  proc = proc + 1;
                }
              }
            }
          }
        }
      }
      *ncell_global = (long)local_d0;
      ref_grid_local._4_4_ = ref_mpi_allsum(ref_mpi_00,ncell_global,1,2);
      if (ref_grid_local._4_4_ == 0) {
        if (ref_mpi_00->n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x6c,"ref_gather_cell_below_quality","malloc counts of REF_INT negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          offset = (REF_GLOB)malloc((long)ref_mpi_00->n << 2);
          if ((void *)offset == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x6c,"ref_gather_cell_below_quality","malloc counts of REF_INT NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            ref_grid_local._4_4_ = ref_mpi_allgather(ref_mpi_00,&proc,(void *)offset,1);
            if (ref_grid_local._4_4_ == 0) {
              quality = 0.0;
              for (counts._4_4_ = 0; counts._4_4_ < ref_mpi_00->id; counts._4_4_ = counts._4_4_ + 1)
              {
                quality = (REF_DBL)((long)*(int *)(offset + (long)counts._4_4_ * 4) + (long)quality)
                ;
              }
              for (counts._4_4_ = 0; counts._4_4_ < ref_mpi_00->n; counts._4_4_ = counts._4_4_ + 1)
              {
                *nnode_global = (long)*(int *)(offset + (long)counts._4_4_ * 4) + *nnode_global;
              }
              if (offset != 0) {
                free((void *)offset);
              }
              for (cell = 0; cell < ref_node_00->max; cell = cell + 1) {
                if ((*l2c)[cell] != -1) {
                  (*l2c)[cell] = (long)quality + (*l2c)[cell];
                }
              }
              ref_grid_local._4_4_ = ref_node_ghost_glob(ref_node_00,*l2c,1);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x7b,"ref_gather_cell_below_quality",(ulong)ref_grid_local._4_4_,"xfer");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x6d,"ref_gather_cell_below_quality",(ulong)ref_grid_local._4_4_,"gather size"
                    );
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x6a,"ref_gather_cell_below_quality",(ulong)ref_grid_local._4_4_,"allsum");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_below_quality(
    REF_GRID ref_grid, REF_CELL ref_cell, REF_DBL min_quality,
    REF_GLOB *nnode_global, REF_LONG *ncell_global, REF_GLOB **l2c) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, part, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_GLOB offset;
  REF_DBL quality;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
    if (ref_mpi_rank(ref_mpi) == part) {
      RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
      if (quality < min_quality) {
        ncell++;
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          if (ref_node_owned(ref_node, nodes[node]) &&
              (REF_EMPTY == (*l2c)[nodes[node]])) {
            (*l2c)[nodes[node]] = nnode;
            nnode++;
          }
        }
      }
    }
  }

  (*ncell_global) = ncell;
  RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += counts[proc];
  }
  each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }